

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsViewPrivate::mapRectToScene
          (QRectF *__return_storage_ptr__,QGraphicsViewPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  double dVar9;
  int iVar12;
  undefined1 auVar10 [16];
  int iVar13;
  undefined1 auVar11 [16];
  qreal qStack_80;
  bool local_70 [80];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  iVar7 = (int)this->scrollX;
  iVar8 = (int)this->scrollY;
  uVar1 = rect->x1;
  uVar3 = rect->y1;
  iVar12 = uVar1 + iVar7;
  auVar10._4_4_ = uVar3 + iVar8;
  uVar2 = rect->x2;
  uVar4 = rect->y2;
  iVar13 = uVar2 + iVar7;
  auVar11._4_4_ = uVar4 + iVar8;
  auVar11._8_4_ = auVar11._4_4_;
  auVar11._12_4_ = -(uint)(auVar11._4_4_ < 0);
  auVar10._8_4_ = auVar10._4_4_;
  auVar10._12_4_ = -(uint)(auVar10._4_4_ < 0);
  dVar6 = (double)((CONCAT44(-(uint)(iVar13 < 0),iVar13) - CONCAT44(-(uint)(iVar12 < 0),iVar12)) + 1
                  );
  dVar9 = (double)((auVar11._8_8_ - auVar10._8_8_) + 1);
  auVar5._8_4_ = SUB84(dVar9,0);
  auVar5._0_8_ = dVar6;
  auVar5._12_4_ = (int)((ulong)dVar9 >> 0x20);
  if ((this->field_0x300 & 0x10) == 0) {
    QTransform::inverted(local_70);
    QTransform::mapRect(__return_storage_ptr__);
  }
  else {
    qStack_80 = auVar5._8_8_;
    __return_storage_ptr__->w = dVar6;
    __return_storage_ptr__->h = qStack_80;
    __return_storage_ptr__->xp = (double)iVar12;
    __return_storage_ptr__->yp = (double)auVar10._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectToScene(const QRect &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    QRectF scrolled = QRectF(rect.translated(scrollX, scrollY));
    return identityMatrix ? scrolled : matrix.inverted().mapRect(scrolled);
}